

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concur19.cc
# Opt level: O3

void __thiscall
tchecker::tck_reach::concur19::graph_t::attributes
          (graph_t *this,node_t *n,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *m)

{
  refzg_t *this_00;
  overflow_error *this_01;
  make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL> *pmVar1;
  const_state_sptr_t local_18;
  
  this_00 = (this->_refzg).super___shared_ptr<tchecker::refzg::refzg_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_18._t = (n->super_node_refzg_state_t)._state._t;
  if (local_18._t != (make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL> *)0x0) {
    pmVar1 = (make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL> *)
             ((long)&((local_18._t[-1].super_state_t._zone._t)->super_zone_t)._vptr_zone_t + 1);
    local_18._t[-1].super_state_t._zone._t = pmVar1;
    if (pmVar1 == (make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL> *)0xfffffffffffffffe)
    {
      this_01 = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error(this_01,"reference counter overflow");
      __cxa_throw(this_01,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
    }
  }
  refzg::refzg_t::attributes(this_00,&local_18,m);
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_18);
  graph::attributes(&n->super_node_flags_t,m);
  return;
}

Assistant:

void graph_t::attributes(tchecker::tck_reach::concur19::node_t const & n, std::map<std::string, std::string> & m) const
{
  _refzg->attributes(n.state_ptr(), m);
  tchecker::graph::attributes(static_cast<tchecker::graph::node_flags_t const &>(n), m);
}